

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

_Bool remove_single_send_data_condition_function
                (void *item,void *match_context,_Bool *continue_processing)

{
  long lVar1;
  long lVar2;
  SEND_CALLBACK_DATA *reference_send_data;
  SEND_CALLBACK_DATA *current_send_data;
  _Bool *continue_processing_local;
  void *match_context_local;
  void *item_local;
  
  lVar1 = *item;
  lVar2 = *match_context;
  if (lVar1 != lVar2) {
    *continue_processing = true;
  }
  else {
    *continue_processing = false;
  }
  item_local._7_1_ = lVar1 == lVar2;
  return item_local._7_1_;
}

Assistant:

static bool remove_single_send_data_condition_function(const void* item, const void* match_context, bool* continue_processing)
{
    SEND_CALLBACK_DATA* current_send_data = (SEND_CALLBACK_DATA*)item;
    SEND_CALLBACK_DATA* reference_send_data = (SEND_CALLBACK_DATA*)match_context;

    if (current_send_data->id == reference_send_data->id)
    {
        *continue_processing = false;
        return true;
    }
    else
    {
        *continue_processing = true;
        return false;
    }
}